

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderExecuteTest.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::ShaderExecuteTest::init(ShaderExecuteTest *this,EVP_PKEY_CTX *ctx)

{
  pointer *pppTVar1;
  Context *pCVar2;
  int extraout_EAX;
  long *plVar3;
  long *plVar4;
  long lVar5;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  string fileName;
  ShaderLibrary shaderLibrary;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> local_98;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58 [2];
  long local_48 [2];
  ShaderLibrary local_38;
  
  pCVar2 = (this->super_TestCaseGroup).m_context;
  deqp::gls::ShaderLibrary::ShaderLibrary
            (&local_38,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar2->m_renderCtx,pCVar2->m_contextInfo);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"shaders/","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_58);
  pppTVar1 = &local_98.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage;
  plVar4 = plVar3 + 2;
  if ((pointer *)*plVar3 == (pointer *)plVar4) {
    local_98.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar4;
    lStack_80 = plVar3[3];
    local_98.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppTVar1;
  }
  else {
    local_98.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar4;
    local_98.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar3;
  }
  local_98.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_68 = *plVar4;
    lStack_60 = plVar3[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar4;
    local_78 = (long *)*plVar3;
  }
  local_70 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_98.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppTVar1) {
    operator_delete(local_98.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  deqp::gls::ShaderLibrary::loadShaderFile(&local_98,&local_38,(char *)local_78);
  if (0 < (int)((ulong)((long)local_98.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_98.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar5 = 0;
    do {
      tcu::TestNode::addChild
                ((TestNode *)this,
                 local_98.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)((ulong)((long)local_98.
                                         super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_98.
                                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  if (local_98.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  deqp::gls::ShaderLibrary::~ShaderLibrary(&local_38);
  return extraout_EAX;
}

Assistant:

void ShaderExecuteTest::init (void)
{
	// Test code.
	gls::ShaderLibrary	shaderLibrary(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
	string				fileName	= string("shaders/") + getName() + ".test";
	vector<TestNode*>	children	= shaderLibrary.loadShaderFile(fileName.c_str());

	for (int i = 0; i < (int)children.size(); i++)
		addChild(children[i]);
}